

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O0

time_t time2sub(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
               int_fast32_t offset,_Bool *okayp,_Bool do_norm_secs)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  time_t tVar4;
  undefined1 local_c0 [8];
  tm mytm;
  tm yourtm;
  time_t t;
  time_t newt;
  undefined4 uStack_60;
  int_fast32_t y;
  time_t hi;
  time_t lo;
  int_fast32_t li;
  int saved_seconds;
  int j;
  int i;
  int dir;
  _Bool do_norm_secs_local;
  _Bool *okayp_local;
  state *psStack_28;
  int_fast32_t offset_local;
  state *sp_local;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp_local;
  tm *tmp_local;
  
  *okayp = false;
  i._3_1_ = do_norm_secs;
  _dir = okayp;
  okayp_local._4_4_ = offset;
  psStack_28 = sp;
  sp_local = (state *)funcp;
  funcp_local = (_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *)tmp;
  memcpy(&mytm.tm_yday,tmp,0x24);
  if (((i._3_1_ & 1) != 0) && (_Var1 = normalize_overflow(&mytm.tm_isdst,&mytm.tm_yday,0x3c), _Var1)
     ) {
    return -1;
  }
  _Var1 = normalize_overflow(&yourtm.tm_sec,&mytm.tm_isdst,0x3c);
  if (_Var1) {
    return -1;
  }
  _Var1 = normalize_overflow(&yourtm.tm_min,&yourtm.tm_sec,0x18);
  if (_Var1) {
    return -1;
  }
  newt._4_4_ = yourtm.tm_mday;
  _Var1 = normalize_overflow32((int_fast32_t *)((long)&newt + 4),&yourtm.tm_hour,0xc);
  if (_Var1) {
    return -1;
  }
  _Var1 = increment_overflow32((int_fast32_t *)((long)&newt + 4),0x76c);
  if (_Var1) {
    return -1;
  }
  for (; yourtm.tm_min < 1; yourtm.tm_min = year_lengths[iVar2] + yourtm.tm_min) {
    _Var1 = increment_overflow32((int_fast32_t *)((long)&newt + 4),-1);
    if (_Var1) {
      return -1;
    }
    lo._0_4_ = newt._4_4_ + (uint)(1 < yourtm.tm_hour);
    iVar2 = _PDCLIB_is_leap((int)lo);
  }
  while (0x16e < yourtm.tm_min) {
    lo._0_4_ = newt._4_4_ + (uint)(1 < yourtm.tm_hour);
    iVar2 = _PDCLIB_is_leap((int)lo);
    yourtm.tm_min = yourtm.tm_min - year_lengths[iVar2];
    _Var1 = increment_overflow32((int_fast32_t *)((long)&newt + 4),1);
    if (_Var1) {
      return -1;
    }
  }
  while( true ) {
    iVar2 = _PDCLIB_is_leap(newt._4_4_);
    saved_seconds = mon_lengths[iVar2][yourtm.tm_hour];
    if (yourtm.tm_min <= saved_seconds) break;
    yourtm.tm_min = yourtm.tm_min - saved_seconds;
    yourtm.tm_hour = yourtm.tm_hour + 1;
    if (0xb < yourtm.tm_hour) {
      yourtm.tm_hour = 0;
      _Var1 = increment_overflow32((int_fast32_t *)((long)&newt + 4),1);
      if (_Var1) {
        return -1;
      }
    }
  }
  _Var1 = increment_overflow32((int_fast32_t *)((long)&newt + 4),-0x76c);
  if (_Var1) {
    return -1;
  }
  if (0x7fffffff < newt._4_4_) {
    return -1;
  }
  yourtm.tm_mday = newt._4_4_;
  if ((mytm.tm_yday < 0) || (0x3b < mytm.tm_yday)) {
    if (newt._4_4_ + 0x76c < 0x7b2) {
      _Var1 = _PDCLIB_increment_overflow(&mytm.tm_yday,-0x3b);
      if (_Var1) {
        return -1;
      }
      lo._4_4_ = mytm.tm_yday;
      mytm.tm_yday = 0x3b;
    }
    else {
      lo._4_4_ = mytm.tm_yday;
      mytm.tm_yday = 0;
    }
  }
  else {
    lo._4_4_ = 0;
  }
  hi = -0x8000000000000000;
  _uStack_60 = 0x7fffffffffffffff;
  while( true ) {
    yourtm._28_8_ = hi / 2 + _uStack_60 / 2;
    if ((long)yourtm._28_8_ < hi) {
      yourtm.tm_yday = (undefined4)hi;
      yourtm.tm_isdst = hi._4_4_;
    }
    else if (_uStack_60 < (long)yourtm._28_8_) {
      yourtm.tm_yday = uStack_60;
      yourtm.tm_isdst = y;
    }
    lVar3 = (*(code *)sp_local)(psStack_28,&yourtm.tm_yday,okayp_local._4_4_,local_c0);
    if (lVar3 == 0) {
      j = -1;
      if (0 < (long)yourtm._28_8_) {
        j = 1;
      }
    }
    else {
      j = tmcomp((tm *)local_c0,(tm *)&mytm.tm_yday);
    }
    if (j == 0) break;
    if (yourtm._28_8_ == hi) {
      if (yourtm._28_8_ == 0x7fffffffffffffff) {
        return -1;
      }
      yourtm._28_8_ = yourtm._28_8_ + 1;
      hi = hi + 1;
    }
    else if (yourtm._28_8_ == _uStack_60) {
      if (yourtm._28_8_ == -0x8000000000000000) {
        return -1;
      }
      yourtm._28_8_ = yourtm._28_8_ + -1;
      _uStack_60 = _uStack_60 + -1;
    }
    if (_uStack_60 < hi) {
      return -1;
    }
    if (j < 1) {
      hi._0_4_ = yourtm.tm_yday;
      hi._4_4_ = yourtm.tm_isdst;
    }
    else {
      uStack_60 = yourtm.tm_yday;
      y = yourtm.tm_isdst;
    }
  }
  if ((-1 < yourtm.tm_wday) && (mytm.tm_wday != yourtm.tm_wday)) {
    if (psStack_28 == (state *)0x0) {
      return -1;
    }
    saved_seconds = psStack_28->typecnt;
    do {
      do {
        saved_seconds = saved_seconds + -1;
        if (saved_seconds < 0) {
          return -1;
        }
      } while ((uint)(psStack_28->ttis[saved_seconds].isdst & 1) != yourtm.tm_wday);
      li = psStack_28->typecnt;
      while (li = li + -1, -1 < li) {
        if ((uint)(psStack_28->ttis[li].isdst & 1) != yourtm.tm_wday) {
          t = (yourtm._28_8_ + (long)psStack_28->ttis[li].utoff) -
              (long)psStack_28->ttis[saved_seconds].utoff;
          lVar3 = (*(code *)sp_local)(psStack_28,&t,okayp_local._4_4_,local_c0);
          if (((lVar3 != 0) && (iVar2 = tmcomp((tm *)local_c0,(tm *)&mytm.tm_yday), iVar2 == 0)) &&
             (mytm.tm_wday == yourtm.tm_wday)) {
            yourtm.tm_yday = (undefined4)t;
            yourtm.tm_isdst = t._4_4_;
            goto LAB_0010404f;
          }
        }
      }
    } while( true );
  }
LAB_0010404f:
  t = yourtm._28_8_ + (long)lo._4_4_;
  if (t < (long)yourtm._28_8_ != lo._4_4_ < 0) {
    return -1;
  }
  yourtm._28_8_ = t;
  lVar3 = (*(code *)sp_local)(psStack_28,&yourtm.tm_yday,okayp_local._4_4_,funcp_local);
  if (lVar3 != 0) {
    *_dir = true;
  }
  tVar4._0_4_ = yourtm.tm_yday;
  tVar4._4_4_ = yourtm.tm_isdst;
  return tVar4;
}

Assistant:

static time_t time2sub( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset, bool * okayp, bool do_norm_secs )
{
    int          dir;
    int          i, j;
    int          saved_seconds;
    int_fast32_t li;
    time_t       lo;
    time_t       hi;
    int_fast32_t y;
    time_t       newt;
    time_t       t;
    struct tm    yourtm, mytm;

    *okayp = false;
    yourtm = *tmp;

    if ( do_norm_secs )
    {
        if ( normalize_overflow( &yourtm.tm_min, &yourtm.tm_sec, SECSPERMIN ) )
        {
            return WRONG;
        }
    }

    if ( normalize_overflow( &yourtm.tm_hour, &yourtm.tm_min, MINSPERHOUR ) )
    {
        return WRONG;
    }

    if ( normalize_overflow( &yourtm.tm_mday, &yourtm.tm_hour, HOURSPERDAY ) )
    {
        return WRONG;
    }

    y = yourtm.tm_year;

    if ( normalize_overflow32( &y, &yourtm.tm_mon, MONSPERYEAR ) )
    {
        return WRONG;
    }

    /* Turn y into an actual year number for now.
       It is converted back to an offset from TM_YEAR_BASE later.
    */
    if ( increment_overflow32( &y, TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    while ( yourtm.tm_mday <= 0 )
    {
        if ( increment_overflow32( &y, -1 ) )
        {
            return WRONG;
        }

        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday += year_lengths[ _PDCLIB_is_leap( li ) ];
    }
    while ( yourtm.tm_mday > DAYSPERLYEAR )
    {
        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday -= year_lengths[ _PDCLIB_is_leap( li ) ];

        if ( increment_overflow32( &y, 1 ) )
        {
            return WRONG;
        }
    }

    for ( ; ; )
    {
        i = mon_lengths[ _PDCLIB_is_leap( y ) ][ yourtm.tm_mon ];

        if ( yourtm.tm_mday <= i )
        {
            break;
        }

        yourtm.tm_mday -= i;

        if ( ++yourtm.tm_mon >= MONSPERYEAR )
        {
            yourtm.tm_mon = 0;

            if ( increment_overflow32( &y, 1 ) )
            {
                return WRONG;
            }
        }
    }

    if ( increment_overflow32( &y, -TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    if ( ! ( _PDCLIB_INT_MIN <= y && y <= _PDCLIB_INT_MAX ) )
    {
        return WRONG;
    }

    yourtm.tm_year = y;

    if ( yourtm.tm_sec >= 0 && yourtm.tm_sec < SECSPERMIN )
    {
        saved_seconds = 0;
    }
    else if ( y + TM_YEAR_BASE < EPOCH_YEAR )
    {
        /* We can't set tm_sec to 0, because that might push the
           time below the minimum representable time.
           Set tm_sec to 59 instead.
           This assumes that the minimum representable time is
           not in the same minute that a leap second was deleted from,
           which is a safer assumption than using 58 would be.
        */
        if ( _PDCLIB_increment_overflow( &yourtm.tm_sec, 1 - SECSPERMIN ) )
        {
            return WRONG;
        }

        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = SECSPERMIN - 1;
    }
    else
    {
        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = 0;
    }

    /* Do a binary search (this works whatever time_t's type is). */
    lo = _PDCLIB_TIME_MIN;
    hi = _PDCLIB_TIME_MAX;

    for ( ; ; )
    {
        t = lo / 2 + hi / 2;

        if ( t < lo )
        {
            t = lo;
        }
        else if ( t > hi )
        {
            t = hi;
        }

        if ( ! funcp( sp, &t, offset, &mytm ) )
        {
            /* Assume that t is too extreme to be represented in
               a struct tm; arrange things so that it is less
               extreme on the next pass.
            */
            dir = ( t > 0 ) ? 1 : -1;
        }
        else
        {
            dir = tmcomp( &mytm, &yourtm );
        }

        if ( dir != 0 )
        {
            if ( t == lo )
            {
                if ( t == _PDCLIB_TIME_MAX )
                {
                    return WRONG;
                }

                ++t;
                ++lo;
            }
            else if ( t == hi )
            {
                if ( t == _PDCLIB_TIME_MIN )
                {
                    return WRONG;
                }

                --t;
                --hi;
            }

            if ( lo > hi )
            {
                return WRONG;
            }

            if ( dir > 0 )
            {
                hi = t;
            }
            else
            {
                lo = t;
            }

            continue;
        }

#if defined TM_GMTOFF && ! UNINIT_TRAP
        if ( mytm.TM_GMTOFF != yourtm.TM_GMTOFF
            && ( yourtm.TM_GMTOFF < 0
            ? ( -SECSPERDAY <= yourtm.TM_GMTOFF
               && ( mytm.TM_GMTOFF <=
                   ( SMALLEST ( _PDCLIB_INT_FAST32_MAX, _PDCLIB_LONG_MAX )
                + yourtm.TM_GMTOFF ) ) )
            : ( yourtm.TM_GMTOFF <= SECSPERDAY
               && ( ( BIGGEST ( _PDCLIB_INT_FAST32_MIN, _PDCLIB_LONG_MIN )
                + yourtm.TM_GMTOFF )
                   <= mytm.TM_GMTOFF ) ) ) )
        {
            /* MYTM matches YOURTM except with the wrong UT offset.
               YOURTM.TM_GMTOFF is plausible, so try it instead.
               It's OK if YOURTM.TM_GMTOFF contains uninitialized data,
               since the guess gets checked.
            */
            time_t altt = t;
            int_fast32_t diff = mytm.TM_GMTOFF - yourtm.TM_GMTOFF;

            if ( ! increment_overflow_time( &altt, diff ) )
            {
                struct tm alttm;
                if ( funcp( sp, &altt, offset, &alttm )
                    && alttm.tm_isdst == mytm.tm_isdst
                    && alttm.TM_GMTOFF == yourtm.TM_GMTOFF
                    && tmcomp( &alttm, &yourtm ) == 0 )
                {
                    t = altt;
                    mytm = alttm;
                }
            }
        }
#endif

        if ( yourtm.tm_isdst < 0 || mytm.tm_isdst == yourtm.tm_isdst )
        {
            break;
        }

        /* Right time, wrong type.
           Hunt for right time, right type.
           It's okay to guess wrong since the guess
           gets checked.
        */
        if ( sp == NULL )
        {
            return WRONG;
        }

        for ( i = sp->typecnt - 1; i >= 0; --i )
        {
            if ( sp->ttis[ i ].isdst != yourtm.tm_isdst )
            {
                continue;
            }

            for ( j = sp->typecnt - 1; j >= 0; --j )
            {
                if ( sp->ttis[ j ].isdst == yourtm.tm_isdst )
                {
                    continue;
                }

                newt = ( t + sp->ttis[ j ].utoff - sp->ttis[ i ].utoff );

                if ( ! funcp( sp, &newt, offset, &mytm ) )
                {
                    continue;
                }

                if ( tmcomp( &mytm, &yourtm ) != 0 )
                {
                    continue;
                }

                if ( mytm.tm_isdst != yourtm.tm_isdst )
                {
                    continue;
                }

                /* We have a match. */
                t = newt;
                goto label;
            }
        }

        return WRONG;
    }

label:
    newt = t + saved_seconds;

    if ( ( newt < t ) != ( saved_seconds < 0 ) )
    {
        return WRONG;
    }

    t = newt;

    if ( funcp( sp, &t, offset, tmp ) )
    {
        *okayp = true;
    }

    return t;
}